

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl::~RpcServerResponseImpl
          (RpcServerResponseImpl *this)

{
  kj::
  Table<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Callbacks>_>
  ::~Table((Table<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Callbacks>_>
            *)&this->resolutionsAtReturnTime);
  BuilderCapabilityTable::~BuilderCapabilityTable(&this->capTable);
  kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::dispose(&this->message);
  return;
}

Assistant:

RpcServerResponseImpl(RpcConnectionState& connectionState,
                          kj::Own<OutgoingRpcMessage>&& message,
                          rpc::Payload::Builder payload)
        : connectionState(connectionState),
          message(kj::mv(message)),
          payload(payload) {}